

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

Transformations exif2Qt(int exifOrientation)

{
  bool bVar1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this;
  int in_EDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffffa8;
  Transformation in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QFlagsStorageHelper<QImageIOHandler::Transformation,_4> local_1c;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QLoggingCategoryMacroHolder<(QtMsgType)1> *)(ulong)(in_EDI - 1);
  switch(this) {
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x0:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x2:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x4:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x5:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x6:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  case (QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x7:
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
    break;
  default:
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcJpeg();
    anon_unknown.dwarf_31195::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              (this,(QLoggingCategory *)
                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_31195::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1074b3);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffc0,(char *)CONCAT44(in_EDI,in_stack_ffffffffffffffb8),
                 (int)((ulong)this >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (char *)0x1074c9);
      QMessageLogger::warning(&stack0xffffffffffffffc0,"Invalid EXIF orientation");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    QFlags<QImageIOHandler::Transformation>::QFlags
              ((QFlags<QImageIOHandler::Transformation> *)this,in_stack_ffffffffffffffac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QImageIOHandler::Transformation,_4>)
         (QFlagsStorageHelper<QImageIOHandler::Transformation,_4>)
         local_1c.super_QFlagsStorage<QImageIOHandler::Transformation>.i;
}

Assistant:

static QImageIOHandler::Transformations exif2Qt(int exifOrientation)
{
    switch (exifOrientation) {
    case 1: // normal
        return QImageIOHandler::TransformationNone;
    case 2: // mirror horizontal
        return QImageIOHandler::TransformationMirror;
    case 3: // rotate 180
        return QImageIOHandler::TransformationRotate180;
    case 4: // mirror vertical
        return QImageIOHandler::TransformationFlip;
    case 5: // mirror horizontal and rotate 270 CW
        return QImageIOHandler::TransformationFlipAndRotate90;
    case 6: // rotate 90 CW
        return QImageIOHandler::TransformationRotate90;
    case 7: // mirror horizontal and rotate 90 CW
        return QImageIOHandler::TransformationMirrorAndRotate90;
    case 8: // rotate 270 CW
        return QImageIOHandler::TransformationRotate270;
    }
    qCWarning(lcJpeg, "Invalid EXIF orientation");
    return QImageIOHandler::TransformationNone;
}